

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfsbfs.cpp
# Opt level: O0

void calculate_diameter(void)

{
  allocator<std::vector<int,_std::allocator<int>_>_> *this;
  pointer *this_00;
  allocator<int> *this_01;
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  reference pvVar4;
  ostream *poVar5;
  ulong uVar6;
  reference piVar7;
  mapped_type *pmVar8;
  double dVar9;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_160;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_158;
  iterator i_4;
  int i_3;
  int minimum;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_140;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_138;
  iterator j_1;
  int i_2;
  int u;
  pointer piStack_120;
  pointer local_118;
  int local_104;
  undefined1 local_100 [4];
  int i_1;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  farthest_path;
  allocator<int> local_dd;
  int j;
  undefined1 local_d8 [8];
  vector<int,_std::allocator<int>_> path;
  undefined1 local_b8 [8];
  vector<int,_std::allocator<int>_> distance_to;
  undefined1 local_98 [4];
  int i;
  vector<int,_std::allocator<int>_> farthest_node;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  max_path;
  allocator<int> local_51;
  vector<int,_std::allocator<int>_> local_50;
  undefined1 local_38 [8];
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  distribution;
  double average_average;
  double average_max;
  int current_max;
  int diameter;
  
  freopen("diameter.txt","w",_stdout);
  average_max._4_4_ = 0;
  average_average = 0.0;
  distribution.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sVar2 = (size_type)V;
  std::allocator<int>::allocator(&local_51);
  std::vector<int,_std::allocator<int>_>::vector(&local_50,0,&local_51);
  this = (allocator<std::vector<int,_std::allocator<int>_>_> *)
         ((long)&max_path.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 3);
  std::allocator<std::vector<int,_std::allocator<int>_>_>::allocator(this);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)local_38,sVar2,&local_50,this);
  std::allocator<std::vector<int,_std::allocator<int>_>_>::~allocator
            ((allocator<std::vector<int,_std::allocator<int>_>_> *)
             ((long)&max_path.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 3));
  std::vector<int,_std::allocator<int>_>::~vector(&local_50);
  std::allocator<int>::~allocator(&local_51);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)&farthest_node.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_98);
  for (distance_to.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage._4_4_ = 0;
      distance_to.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ < V;
      distance_to.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ =
           distance_to.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
           ._M_end_of_storage._4_4_ + 1) {
    sVar2 = (size_type)V;
    path.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ = 0;
    this_01 = (allocator<int> *)
              ((long)&path.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage + 3);
    std::allocator<int>::allocator(this_01);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_b8,sVar2,
               (value_type_conflict *)
               ((long)&path.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 4),this_01);
    std::allocator<int>::~allocator
              ((allocator<int> *)
               ((long)&path.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 3));
    sVar2 = (size_type)V;
    j = -1;
    std::allocator<int>::allocator(&local_dd);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_d8,sVar2,&j,&local_dd);
    std::allocator<int>::~allocator(&local_dd);
    std::vector<bool,_std::allocator<bool>_>::clear
              ((vector<bool,_std::allocator<bool>_> *)(anonymous_namespace)::usedbfs);
    std::vector<bool,_std::allocator<bool>_>::resize
              ((vector<bool,_std::allocator<bool>_> *)(anonymous_namespace)::usedbfs,(long)V,false);
    bfs(distance_to.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_,(vector<int,_std::allocator<int>_> *)local_b8,
        (vector<int,_std::allocator<int>_> *)local_d8);
    average_max._0_4_ = 0;
    for (farthest_path.
         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
        farthest_path.
        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ < V;
        farthest_path.
        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
             farthest_path.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_b8,
                          (long)farthest_path.
                                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
      distribution.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)((double)*pvVar3 +
                    (double)distribution.
                            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_b8,
                          (long)farthest_path.
                                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
      if (average_max._0_4_ < *pvVar3) {
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_b8,
                            (long)farthest_path.
                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
        average_max._0_4_ = *pvVar3;
      }
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_b8,
                          (long)farthest_path.
                                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
      if (average_max._4_4_ < *pvVar3) {
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_b8,
                            (long)farthest_path.
                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
        average_max._4_4_ = *pvVar3;
        std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)local_98)
        ;
        this_00 = &farthest_node.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::clear((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *)this_00);
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::push_back((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     *)this_00,(value_type *)local_d8);
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)local_98,
                   (value_type_conflict *)
                   ((long)&farthest_path.
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
      }
      else {
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_b8,
                            (long)farthest_path.
                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
        if (*pvVar3 == average_max._4_4_) {
          std::
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::push_back((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       *)&farthest_node.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,(value_type *)local_d8);
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)local_98,
                     (value_type_conflict *)
                     ((long)&farthest_path.
                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
        }
      }
    }
    average_average = average_average + (double)average_max._0_4_;
    pvVar4 = std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           *)local_38,(long)average_max._0_4_);
    std::vector<int,_std::allocator<int>_>::push_back
              (pvVar4,(value_type_conflict *)
                      ((long)&distance_to.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage + 4));
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_d8);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_b8);
  }
  dVar9 = (double)V;
  distribution.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)((double)distribution.
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage / (double)(V * V));
  poVar5 = std::operator<<((ostream *)&std::cout,"Diameter: ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,average_max._4_4_);
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<((ostream *)&std::cout,"Average path: ");
  poVar5 = (ostream *)
           std::ostream::operator<<
                     (poVar5,(double)distribution.
                                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<((ostream *)&std::cout,"Average farthest path: ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,average_average / dVar9);
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)local_100);
  for (local_104 = 0; uVar6 = (ulong)local_104,
      sVar2 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)local_98), uVar6 < sVar2;
      local_104 = local_104 + 1) {
    _i_2 = (pointer)0x0;
    piStack_120 = (pointer)0x0;
    local_118 = (pointer)0x0;
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)&i_2);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::push_back((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *)local_100,(vector<int,_std::allocator<int>_> *)&i_2);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&i_2);
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_98,(long)local_104);
    j_1._M_current._4_4_ = *pvVar3;
    while (j_1._M_current._4_4_ != -1) {
      pvVar4 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             *)local_100,(long)local_104);
      std::vector<int,_std::allocator<int>_>::push_back
                (pvVar4,(value_type_conflict *)((long)&j_1._M_current + 4));
      pvVar4 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             *)&farthest_node.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage,(long)local_104);
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](pvVar4,(long)j_1._M_current._4_4_)
      ;
      j_1._M_current._4_4_ = *pvVar3;
    }
  }
  poVar5 = std::operator<<((ostream *)&std::cout,"Farthest paths:");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  for (j_1._M_current._0_4_ = 0; uVar6 = (ulong)(int)j_1._M_current,
      sVar2 = std::
              vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ::size((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      *)local_100), uVar6 < sVar2; j_1._M_current._0_4_ = (int)j_1._M_current + 1) {
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)j_1._M_current + 1);
    std::operator<<(poVar5,": ");
    pvVar4 = std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           *)local_100,(long)(int)j_1._M_current);
    local_138._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(pvVar4);
    while( true ) {
      pvVar4 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             *)local_100,(long)(int)j_1._M_current);
      local_140._M_current = (int *)std::vector<int,_std::allocator<int>_>::end(pvVar4);
      bVar1 = __gnu_cxx::operator!=(&local_138,&local_140);
      if (!bVar1) break;
      piVar7 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&local_138);
      pmVar8 = std::
               map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&name_abi_cxx11_,piVar7);
      poVar5 = std::operator<<((ostream *)&std::cout,(string *)pmVar8);
      std::operator<<(poVar5,". ");
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&local_138,0);
    }
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  }
  i_4._M_current._4_4_ = V;
  poVar5 = std::operator<<((ostream *)&std::cout,"Farthest paths distribution:");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  for (i_4._M_current._0_4_ = 0; (int)i_4._M_current <= average_max._4_4_;
      i_4._M_current._0_4_ = (int)i_4._M_current + 1) {
    pvVar4 = std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           *)local_38,(long)(int)i_4._M_current);
    sVar2 = std::vector<int,_std::allocator<int>_>::size(pvVar4);
    if ((sVar2 != 0) && ((int)i_4._M_current < i_4._M_current._4_4_)) {
      i_4._M_current._4_4_ = (int)i_4._M_current;
    }
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)i_4._M_current);
    poVar5 = std::operator<<(poVar5,": ");
    pvVar4 = std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           *)local_38,(long)(int)i_4._M_current);
    sVar2 = std::vector<int,_std::allocator<int>_>::size(pvVar4);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,sVar2);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  }
  poVar5 = std::operator<<((ostream *)&std::cout,"Characters with minimum farthest path:");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  pvVar4 = std::
           vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         *)local_38,(long)i_4._M_current._4_4_);
  local_158._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(pvVar4);
  while( true ) {
    pvVar4 = std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           *)local_38,(long)i_4._M_current._4_4_);
    local_160._M_current = (int *)std::vector<int,_std::allocator<int>_>::end(pvVar4);
    bVar1 = __gnu_cxx::operator!=(&local_158,&local_160);
    if (!bVar1) break;
    piVar7 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&local_158);
    pmVar8 = std::
             map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&name_abi_cxx11_,piVar7);
    poVar5 = std::operator<<((ostream *)&std::cout,(string *)pmVar8);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_158,0);
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)local_100);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_98);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)&farthest_node.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)local_38);
  return;
}

Assistant:

void calculate_diameter() {
    freopen("diameter.txt", "w", stdout); // output file

    int diameter = 0;
    int current_max = 0;
    double average_max = 0;
    double average_average = 0;
    vector< vector<int> > distribution(V, vector<int> (0));
    vector< vector<int> > max_path;
    vector<int> farthest_node;
    for (int i = 0; i < V; i++) {
        vector<int> distance_to(V, 0);
        vector<int> path(V,-1);
        usedbfs.clear();
        usedbfs.resize(V, false);
        bfs(i, distance_to, path);
        current_max = 0;
        for (int j = 0; j < V; j++) {
            average_average += distance_to[j];

            if (distance_to[j] > current_max)
                current_max = distance_to[j];

            if (distance_to[j] > diameter) {
                diameter = distance_to[j];
                farthest_node.clear();
                max_path.clear();
                max_path.push_back(path);
                farthest_node.push_back(j);
            } else if (distance_to[j] == diameter){
                max_path.push_back(path);
                farthest_node.push_back(j);
            }
        }
        average_max += current_max;
        distribution[current_max].push_back(i);
    }
    average_max /= V;
    average_average /= V*V;

    cout << "Diameter: " << diameter << endl;
    cout << "Average path: " << average_average << endl;
    cout << "Average farthest path: " << average_max << endl;

    vector < vector<int> > farthest_path;

    for (int i = 0; i < farthest_node.size(); i++) {
        farthest_path.push_back(vector<int>());
        for (int u = farthest_node[i]; u != -1; u = max_path[i][u])
            farthest_path[i].push_back(u);
    }

    cout << "Farthest paths:" << endl;
    for (int i = 0; i < farthest_path.size(); i++) {
        cout << i+1 << ": ";
        for (vector<int>::iterator j = farthest_path[i].begin(); j != farthest_path[i].end(); j++)
            cout << name[*j] << ". ";
        cout << endl;
    }

    int minimum = V;
    cout << "Farthest paths distribution:" << endl;
    for (int i = 0; i <= diameter; i++) {
        if (distribution[i].size() != 0 && i < minimum)
            minimum = i;

        cout << i << ": " << distribution[i].size() << endl;
    }

    cout << "Characters with minimum farthest path:" << endl;
    for (vector<int>::iterator i = distribution[minimum].begin(); i != distribution[minimum].end(); i++) {
        cout << name[*i] << endl;
    }
}